

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O1

int __thiscall Confparse::SaveDefault(Confparse *this,path *filepath)

{
  char cVar1;
  ofstream file;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220);
  std::ofstream::open((char *)&local_220,(_Ios_Openmode)(filepath->_M_pathname)._M_dataplus._M_p);
  this->nested = true;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ostream::write((char *)&local_220,0x22f900);
    std::ofstream::close();
    Load(this,filepath,false);
  }
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _roundf;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return (uint)(cVar1 == '\0');
}

Assistant:

int Confparse::SaveDefault(const filesystem::path &filepath) {
	ofstream file;
	file.open(filepath, std::ios::out | std::ios::binary | std::ios::ate);

	nested = true;
	if (file.is_open()) {
		file.write(default_conf, sizeof(default_conf) - 1);
		file.close();
		Load(filepath);

		return 0;
	} else {
		return 1;
	}
}